

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpositer.cpp
# Opt level: O3

void __thiscall
icu_63::FieldPositionIterator::FieldPositionIterator
          (FieldPositionIterator *this,FieldPositionIterator *rhs)

{
  uint in_EAX;
  UVector32 *this_00;
  UErrorCode status;
  undefined8 uStack_28;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__FieldPositionIterator_003efd90;
  this->data = (UVector32 *)0x0;
  this->pos = rhs->pos;
  if (rhs->data != (UVector32 *)0x0) {
    uStack_28 = (ulong)in_EAX;
    this_00 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,(size_t)rhs);
    UVector32::UVector32(this_00,(UErrorCode *)((long)&uStack_28 + 4));
    this->data = this_00;
    UVector32::assign(this_00,rhs->data,(UErrorCode *)((long)&uStack_28 + 4));
    if (uStack_28._4_4_ != 0) {
      if (this->data != (UVector32 *)0x0) {
        (*(this->data->super_UObject)._vptr_UObject[1])();
      }
      this->data = (UVector32 *)0x0;
      this->pos = -1;
    }
  }
  return;
}

Assistant:

FieldPositionIterator::FieldPositionIterator(const FieldPositionIterator &rhs)
  : UObject(rhs), data(NULL), pos(rhs.pos) {

  if (rhs.data) {
    UErrorCode status = U_ZERO_ERROR;
    data = new UVector32(status);
    data->assign(*rhs.data, status);
    if (status != U_ZERO_ERROR) {
      delete data;
      data = NULL;
      pos = -1;
    }
  }
}